

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaAllocator_T::ImportVulkanFunctions(VmaAllocator_T *this,VmaVulkanFunctions *pVulkanFunctions)

{
  if (pVulkanFunctions != (VmaVulkanFunctions *)0x0) {
    ImportVulkanFunctions_Custom(this,pVulkanFunctions);
  }
  ImportVulkanFunctions_Dynamic(this);
  return;
}

Assistant:

void VmaAllocator_T::ImportVulkanFunctions(const VmaVulkanFunctions* pVulkanFunctions)
{
#if VMA_STATIC_VULKAN_FUNCTIONS == 1
    ImportVulkanFunctions_Static();
#endif

    if(pVulkanFunctions != VMA_NULL)
    {
        ImportVulkanFunctions_Custom(pVulkanFunctions);
    }

#if VMA_DYNAMIC_VULKAN_FUNCTIONS == 1
    ImportVulkanFunctions_Dynamic();
#endif

    ValidateVulkanFunctions();
}